

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_graph.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1d5f4c::sanity_check_name
          (anon_unknown_dwarf_1d5f4c *this,string_view name,char *explanation)

{
  anon_unknown_dwarf_1d5f4c aVar1;
  int iVar2;
  GraphFileError *this_00;
  anon_unknown_dwarf_1d5f4c __c;
  anon_unknown_dwarf_1d5f4c *paVar3;
  difference_type __n;
  long lVar4;
  allocator<char> local_111;
  string safe_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar4 = 0;
  for (paVar3 = (anon_unknown_dwarf_1d5f4c *)0x0; this != paVar3; paVar3 = paVar3 + 1) {
    iVar2 = isgraph((uint)(byte)paVar3[name._M_len]);
    lVar4 = lVar4 + (ulong)(iVar2 == 0);
  }
  if (lVar4 == 0) {
    return;
  }
  safe_name._M_dataplus._M_p = (pointer)&safe_name.field_2;
  safe_name._M_string_length = 0;
  safe_name.field_2._M_local_buf[0] = '\0';
  for (paVar3 = (anon_unknown_dwarf_1d5f4c *)0x0; this != paVar3; paVar3 = paVar3 + 1) {
    aVar1 = paVar3[name._M_len];
    iVar2 = isgraph((uint)(byte)aVar1);
    __c = (anon_unknown_dwarf_1d5f4c)0x3f;
    if (iVar2 != 0) {
      __c = aVar1;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&safe_name,(char)__c);
  }
  this_00 = (GraphFileError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,name._M_str,&local_111);
  std::operator+(&local_b0,"Suspicious input detected: ",&local_d0);
  std::operator+(&local_90,&local_b0," \'");
  std::__cxx11::string::string((string *)&local_f0,&safe_name);
  std::operator+(&local_70,&local_90,&local_f0);
  std::operator+(&local_50,&local_70,"\' contains non-printable characters");
  GraphFileError::GraphFileError(this_00,&local_50);
  __cxa_throw(this_00,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
}

Assistant:

auto sanity_check_name(string_view name, const char * const explanation) -> void
    {
        if (0 != count_if(name.begin(), name.end(), [](unsigned char c) { return ! isgraph(c); })) {
            string safe_name;
            transform(name.begin(), name.end(), back_inserter(safe_name), [](unsigned char c) { return isgraph(c) ? c : '?'; });
            throw GraphFileError("Suspicious input detected: " + string(explanation) + " '" + string(safe_name) + "' contains non-printable characters");
        }
    }